

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper-api.c
# Opt level: O3

uint64_t tlv_decode_segno(name_component_t *comp)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = 0xffffffffffffffff;
  if (((comp->type == 8) && (1 < (ulong)comp->size)) && (comp->value[0] == '\0')) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 << 8 | (ulong)comp->value[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while ((ulong)comp->size - 1 != lVar2);
  }
  return uVar1;
}

Assistant:

uint64_t
tlv_decode_segno(name_component_t* comp)
{
  int i;
  uint64_t ret = 0;

  if (comp->type != TLV_GenericNameComponent ||
     comp->size < 2 ||
     comp->value[0] != 0) {
    return (uint64_t)-1;
  }
  for (i = 1; i < comp->size; i ++) {
    ret = ret * 0x100 + comp->value[i];
  }
  return ret;
}